

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::taylor_inplace_multiplier<double,_2,_1,_8,_1>::mul(double *p1,double *p2)

{
  int iVar1;
  long lVar2;
  
  iVar1 = binomial(3,1);
  if (1 < iVar1) {
    lVar2 = 1;
    do {
      p1[lVar2] = p2[lVar2] * *p1 + p1[lVar2];
      lVar2 = lVar2 + 1;
      iVar1 = binomial(3,1);
    } while (lVar2 < iVar1);
  }
  *p1 = *p2 * *p1;
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    if (Ndeg <= Ndeg2) {
      for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
           i < binomial(Nvar + Ndeg, Ndeg);
           i++)
        p1[i] += p2[i] * p1[0];
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg - 1, Ndeg2, 0>::mul(
        p1, p2); // Do lower degree terms, or go to (4)
  }